

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_in_place(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  for (iVar6 = 0; pRVar1 = ref_grid->cell[6], iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
    RVar3 = ref_cell_nodes(pRVar1,iVar6,nodes);
    if ((RVar3 == 0) &&
       (uVar4 = ref_shard_add_qua_as_tri(ref_node,ref_grid->cell[3],nodes), uVar4 != 0)) {
      pcVar7 = "add qua tri";
      uVar5 = 0x4a6;
      goto LAB_0019b03a;
    }
  }
  uVar4 = ref_cell_free(pRVar1);
  if (uVar4 == 0) {
    uVar4 = ref_cell_create(ref_grid->cell + 6,REF_CELL_QUA);
    if (uVar4 == 0) {
      for (iVar6 = 0; pRVar1 = ref_grid->cell[9], iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
        RVar3 = ref_cell_nodes(pRVar1,iVar6,nodes);
        if ((RVar3 == 0) &&
           (uVar4 = ref_shard_add_pyr_as_tet(ref_node,ref_grid->cell[8],nodes,0), uVar4 != 0)) {
          pcVar7 = "add pyr tet";
          uVar5 = 0x4ae;
          goto LAB_0019b03a;
        }
      }
      uVar4 = ref_cell_free(pRVar1);
      if (uVar4 == 0) {
        uVar4 = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
        if (uVar4 == 0) {
          for (iVar6 = 0; pRVar1 = ref_grid->cell[10], iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
            RVar3 = ref_cell_nodes(pRVar1,iVar6,nodes);
            if ((RVar3 == 0) &&
               (uVar4 = ref_shard_add_pri_as_tet(ref_node,ref_grid->cell[8],nodes,0), uVar4 != 0)) {
              pcVar7 = "add pri tet";
              uVar5 = 0x4b6;
              goto LAB_0019b03a;
            }
          }
          uVar4 = ref_cell_free(pRVar1);
          if (uVar4 == 0) {
            uVar4 = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
            if (uVar4 == 0) {
              for (iVar6 = 0; pRVar1 = ref_grid->cell[0xb], iVar6 < pRVar1->max; iVar6 = iVar6 + 1)
              {
                RVar3 = ref_cell_nodes(pRVar1,iVar6,nodes);
                if ((RVar3 == 0) &&
                   (uVar4 = ref_shard_add_hex_as_tet(ref_node,ref_grid->cell[8],nodes), uVar4 != 0))
                {
                  pcVar7 = "add hex tet";
                  uVar5 = 0x4bd;
                  goto LAB_0019b03a;
                }
              }
              uVar4 = ref_cell_free(pRVar1);
              if (uVar4 == 0) {
                uVar4 = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (uVar4 == 0) {
                  lVar8 = 0;
                  while( true ) {
                    if (ref_node->max <= lVar8) {
                      return 0;
                    }
                    if ((((-1 < ref_node->global[lVar8]) &&
                         ((pRVar2 = ref_grid->cell[3]->ref_adj, pRVar2->nnode <= lVar8 ||
                          (pRVar2->first[lVar8] == -1)))) &&
                        ((pRVar2 = ref_grid->cell[8]->ref_adj, pRVar2->nnode <= lVar8 ||
                         (pRVar2->first[lVar8] == -1)))) &&
                       (uVar4 = ref_node_remove_without_global(ref_node,(REF_INT)lVar8), uVar4 != 0)
                       ) break;
                    lVar8 = lVar8 + 1;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x4c5,"ref_shard_in_place",(ulong)uVar4,"hanging node");
                  return uVar4;
                }
                pcVar7 = "hex create";
                uVar5 = 0x4c0;
              }
              else {
                pcVar7 = "free hex";
                uVar5 = 0x4bf;
              }
            }
            else {
              pcVar7 = "pri create";
              uVar5 = 0x4b9;
            }
          }
          else {
            pcVar7 = "free pri";
            uVar5 = 0x4b8;
          }
        }
        else {
          pcVar7 = "pyr create";
          uVar5 = 0x4b1;
        }
      }
      else {
        pcVar7 = "free pyr";
        uVar5 = 0x4b0;
      }
    }
    else {
      pcVar7 = "qua create";
      uVar5 = 0x4a9;
    }
  }
  else {
    pcVar7 = "free qua";
    uVar5 = 0x4a8;
  }
LAB_0019b03a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5,
         "ref_shard_in_place",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_shard_in_place(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL check_volume = REF_FALSE;

  each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell, nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, ref_grid_tri(ref_grid), nodes),
        "add qua tri");
  }
  RSS(ref_cell_free(ref_grid_qua(ref_grid)), "free qua");
  RSS(ref_cell_create(&ref_grid_qua(ref_grid), REF_CELL_QUA), "qua create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pyr tet");
  }
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "free pyr");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_node, ref_grid_tet(ref_grid), nodes,
                                 check_volume),
        "add pri tet");
  }
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "free pri");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");

  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_node, ref_grid_tet(ref_grid), nodes),
        "add hex tet");
  }
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "free hex");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hanging node");
    }
  }

  return REF_SUCCESS;
}